

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_text_xml_encode(FILE *out,char *word)

{
  char cVar1;
  char *local_20;
  char *ptr;
  char *word_local;
  FILE *out_local;
  
  for (local_20 = word; *local_20 != '\0'; local_20 = local_20 + 1) {
    cVar1 = *local_20;
    if (cVar1 == '&') {
      fputs("&amp;",(FILE *)out);
    }
    else if (cVar1 == '<') {
      fputs("&lt;",(FILE *)out);
    }
    else if (cVar1 == '>') {
      fputs("&gt;",(FILE *)out);
    }
    else {
      fputc((int)*local_20,(FILE *)out);
    }
  }
  return;
}

Assistant:

static void
print_text_xml_encode(FILE *out, const char *word)
{
    const char *ptr;

    for (ptr = word; ptr[0]; ++ptr) {
        switch (ptr[0]) {
        case '<':
            fputs("&lt;", out);
            break;
        case '>':
            fputs("&gt;", out);
            break;
        case '&':
            fputs("&amp;", out);
            break;
        /* not really necessary, I guess... */
        /*case '\'':
            fputs("&apos;", out);
            break;
        case '\"':
            fputs("&quot;", out);
            break;*/
        default:
            fputc(ptr[0], out);
            break;
        }
    }
}